

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_read_image.cxx
# Opt level: O1

uchar * read_win_rectangle(uchar *p,int X,int Y,int w,int h,int alpha)

{
  byte bVar1;
  Visual *pVVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  XVisualInfo *pXVar7;
  ushort uVar8;
  int iVar9;
  int iVar10;
  Fl_Window *pFVar11;
  void *__ptr;
  undefined8 uVar12;
  long lVar13;
  uchar *__s;
  XColor *pXVar14;
  uchar *puVar15;
  ulong uVar16;
  int iVar17;
  unsigned_long uVar18;
  long lVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  uchar uVar23;
  uint uVar24;
  byte bVar25;
  byte bVar26;
  byte bVar27;
  uint uVar28;
  uint uVar29;
  uint *puVar30;
  unsigned_long uVar31;
  byte *pbVar32;
  int iVar33;
  uint uVar34;
  ulong uVar35;
  uchar *puVar36;
  bool bVar37;
  int *piStack_13088;
  long lStack_13070;
  ulong uStack_13068;
  int sh;
  int sw;
  int sy;
  int dy;
  int iStack_13040;
  int sx;
  uchar cvals [4096] [3];
  XColor colors [4096];
  
  iVar9 = -w;
  iVar22 = w;
  if (w < 1) {
    iVar22 = iVar9;
  }
  iStack_13040 = alpha;
  if ((w < 0) || (pFVar11 = fl_find(fl_window), pFVar11 != (Fl_Window *)0x0)) {
    XTranslateCoordinates
              (fl_display,fl_window,
               *(undefined8 *)(*(long *)(fl_display + 0xe8) + 0x10 + (long)fl_screen * 0x80),X,Y,
               cvals,&dy,colors);
    Fl::screen_xywh(&sx,&sy,&sw,&sh,fl_screen);
    pXVar7 = fl_visual;
    if (((int)cvals._0_4_ < sx) ||
       (((dy < sy || (sw + sx < cvals._0_4_ + iVar22)) || (sy + sh < dy + h)))) {
      iVar21 = sx;
      if (cvals._0_4_ - sx != 0 && sx <= (int)cvals._0_4_) {
        iVar21 = cvals._0_4_;
      }
      iVar3 = -(cvals._0_4_ - sx);
      if (sx <= (int)cvals._0_4_) {
        iVar3 = 0;
      }
      iVar4 = (sx + sw) - iVar21;
      if ((iVar22 - iVar3) + iVar21 <= sx + sw) {
        iVar4 = iVar22 - iVar3;
      }
      iVar21 = sy;
      if (dy - sy != 0 && sy <= dy) {
        iVar21 = dy;
      }
      iVar33 = -(dy - sy);
      piStack_13088 = (int *)0x0;
      if (sy <= dy) {
        iVar33 = 0;
      }
      iVar5 = (sy + sh) - iVar21;
      if ((h - iVar33) + iVar21 <= sy + sh) {
        iVar5 = h - iVar33;
      }
      bVar37 = false;
      if ((0 < iVar4) && (0 < iVar5)) {
        iVar21 = fl_visual->depth;
        iVar10 = iVar21 + 7;
        if (-1 < iVar21) {
          iVar10 = iVar21;
        }
        iVar17 = (iVar10 >> 3) - ((iVar10 >> 3) - (iVar10 >> 0x1f) & 0x1ffffffeU);
        iVar10 = iVar21 + iVar17 * 8;
        iVar17 = iVar21 + iVar17 * 8 + 7;
        if (-1 < iVar10) {
          iVar17 = iVar10;
        }
        __ptr = malloc((long)(iVar22 * h * (iVar17 >> 3)));
        piStack_13088 =
             (int *)XCreateImage(fl_display,pXVar7->visual,iVar21,2,0,__ptr,iVar22,h,iVar10,0);
        if (piStack_13088 == (int *)0x0) {
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
        }
        else {
          uVar12 = XSetErrorHandler(xgetimageerrhandler);
          lVar13 = XGetSubImage(fl_display,fl_window,X + iVar3,Y + iVar33,iVar4,iVar5,
                                0xffffffffffffffff,2,piStack_13088,iVar3,iVar33);
          XSetErrorHandler(uVar12);
          bVar37 = lVar13 != 0;
          if (bVar37) goto LAB_0019c040;
          (**(code **)(piStack_13088 + 0x18))(piStack_13088);
        }
        bVar37 = false;
      }
      goto LAB_0019c040;
    }
  }
  uVar12 = XSetErrorHandler(xgetimageerrhandler);
  piStack_13088 = (int *)XGetImage(fl_display,fl_window,X,Y,iVar22,h,0xffffffffffffffff,2);
  XSetErrorHandler(uVar12);
  bVar37 = true;
LAB_0019c040:
  iVar21 = iStack_13040;
  __s = (uchar *)0x0;
  if ((bVar37) && (piStack_13088 != (int *)0x0)) {
    uVar24 = 4 - (iStack_13040 == 0);
    __s = p;
    if (p == (uchar *)0x0) {
      __s = (uchar *)operator_new__((long)(int)(iVar22 * h * uVar24));
    }
    memset(__s,iVar21,(long)(int)(iVar22 * h * uVar24));
    if ((*(long *)(piStack_13088 + 0xe) == 0) && (0xc < piStack_13088[0xc])) {
      pVVar2 = fl_visual->visual;
      *(unsigned_long *)(piStack_13088 + 0xe) = pVVar2->red_mask;
      *(unsigned_long *)(piStack_13088 + 0x10) = pVVar2->green_mask;
      *(unsigned_long *)(piStack_13088 + 0x12) = pVVar2->blue_mask;
    }
    uVar16 = *(ulong *)(piStack_13088 + 0xe);
    if (uVar16 == 0) {
      iVar22 = fl_visual->visual->map_entries;
      uVar31 = (unsigned_long)iVar22;
      if (0 < (long)uVar31) {
        pXVar14 = colors;
        uVar18 = 0;
        do {
          pXVar14->pixel = uVar18;
          uVar18 = uVar18 + 1;
          pXVar14 = pXVar14 + 1;
        } while (uVar31 != uVar18);
      }
      XQueryColors(fl_display,fl_colormap,colors);
      if (0 < iVar22) {
        puVar15 = cvals[0] + 2;
        lVar13 = 0;
        do {
          (*(uchar (*) [3])(puVar15 + -2))[0] = *(uchar *)((long)&colors[0].red + lVar13 + 1);
          puVar15[-1] = *(uchar *)((long)&colors[0].green + lVar13 + 1);
          *puVar15 = *(uchar *)((long)&colors[0].blue + lVar13 + 1);
          puVar15 = puVar15 + 3;
          lVar13 = lVar13 + 0x10;
        } while (uVar31 * 0x10 != lVar13);
      }
      if (0 < piStack_13088[1]) {
        if (iVar9 < w) {
          iVar9 = w;
        }
        uVar16 = 0;
        lVar13 = 0;
        do {
          if (piStack_13088[0xc] - 1U < 0xc) {
            pbVar32 = (byte *)((long)(int)lVar13 * (long)piStack_13088[0xb] +
                              *(long *)(piStack_13088 + 4));
            switch(piStack_13088[0xc]) {
            case 1:
              if (0 < *piStack_13088) {
                puVar36 = __s + uVar16 + 2;
                iVar22 = *piStack_13088 + 1;
                uVar34 = 0x80;
                do {
                  if ((uVar34 & *pbVar32) == 0) {
                    puVar36[-2] = cvals[0][0];
                    puVar36[-1] = cvals[0][1];
                    uVar23 = cvals[0][2];
                  }
                  else {
                    puVar36[-2] = cvals[1][0];
                    puVar36[-1] = cvals[1][1];
                    uVar23 = cvals[1][2];
                  }
                  pbVar32 = pbVar32 + (uVar34 < 2);
                  bVar37 = uVar34 < 2;
                  *puVar36 = uVar23;
                  uVar34 = uVar34 >> 1;
                  if (bVar37) {
                    uVar34 = 0x80;
                  }
                  iVar22 = iVar22 + -1;
                  puVar36 = puVar36 + uVar24;
                } while (1 < iVar22);
              }
              break;
            case 2:
              if (0 < *piStack_13088) {
                puVar36 = __s + uVar16 + 2;
                iVar21 = *piStack_13088 + 1;
                iVar22 = 6;
                do {
                  uVar34 = *pbVar32 >> ((byte)iVar22 & 0x1f) & 3;
                  puVar36[-2] = cvals[uVar34][0];
                  puVar36[-1] = cvals[uVar34][1];
                  *puVar36 = cvals[uVar34][2];
                  bVar37 = iVar22 == 0;
                  iVar22 = iVar22 + -2;
                  if (bVar37) {
                    iVar22 = 6;
                  }
                  pbVar32 = pbVar32 + bVar37;
                  iVar21 = iVar21 + -1;
                  puVar36 = puVar36 + uVar24;
                } while (1 < iVar21);
              }
              break;
            case 4:
              if (0 < *piStack_13088) {
                puVar36 = __s + uVar16 + 2;
                iVar22 = *piStack_13088 + 1;
                bVar37 = true;
                do {
                  bVar37 = !bVar37;
                  bVar25 = *pbVar32 >> 4;
                  if (bVar37) {
                    bVar25 = *pbVar32 & 0xf;
                  }
                  puVar36[-2] = cvals[bVar25][0];
                  puVar36[-1] = cvals[bVar25][1];
                  *puVar36 = cvals[bVar25][2];
                  pbVar32 = pbVar32 + bVar37;
                  iVar22 = iVar22 + -1;
                  puVar36 = puVar36 + uVar24;
                } while (1 < iVar22);
              }
              break;
            case 8:
              if (0 < *piStack_13088) {
                puVar36 = __s + uVar16 + 2;
                iVar22 = *piStack_13088 + 1;
                do {
                  puVar36[-2] = cvals[*pbVar32][0];
                  puVar36[-1] = cvals[*pbVar32][1];
                  *puVar36 = cvals[*pbVar32][2];
                  pbVar32 = pbVar32 + 1;
                  iVar22 = iVar22 + -1;
                  puVar36 = puVar36 + uVar24;
                } while (1 < iVar22);
              }
              break;
            case 0xc:
              if (0 < *piStack_13088) {
                puVar36 = __s + uVar16 + 2;
                iVar22 = *piStack_13088 + 1;
                bVar37 = false;
                do {
                  if (bVar37) {
                    uVar35 = (ulong)((pbVar32[1] & 0xf) << 8) | (ulong)pbVar32[2];
                    lVar19 = 3;
                  }
                  else {
                    uVar35 = (ulong)((uint)(pbVar32[1] >> 4) | (uint)*pbVar32 << 4);
                    lVar19 = 0;
                  }
                  bVar37 = !bVar37;
                  puVar36[-2] = cvals[uVar35][0];
                  puVar36[-1] = cvals[uVar35][1];
                  *puVar36 = cvals[uVar35][2];
                  pbVar32 = pbVar32 + lVar19;
                  iVar22 = iVar22 + -1;
                  puVar36 = puVar36 + uVar24;
                } while (1 < iVar22);
              }
            }
          }
          lVar13 = lVar13 + 1;
          uVar16 = (ulong)((int)uVar16 + iVar9 * uVar24);
        } while (lVar13 < piStack_13088[1]);
      }
    }
    else {
      bVar25 = 0;
      if ((uVar16 & 1) == 0) {
        bVar26 = 0;
        uVar35 = uVar16 & 0xffffffff;
        do {
          uVar35 = uVar35 >> 1;
          bVar26 = bVar26 + 1;
          uVar6 = uVar16 & 2;
          uVar34 = (uint)uVar35;
          uVar16 = uVar35;
        } while (uVar6 == 0);
      }
      else {
        uVar34 = (uint)uVar16;
        bVar26 = 0;
      }
      uVar16 = *(ulong *)(piStack_13088 + 0x10);
      if ((uVar16 & 1) == 0) {
        bVar25 = 0;
        uVar35 = uVar16 & 0xffffffff;
        do {
          uVar35 = uVar35 >> 1;
          bVar25 = bVar25 + 1;
          uVar6 = uVar16 & 2;
          uVar28 = (uint)uVar35;
          uVar16 = uVar35;
        } while (uVar6 == 0);
      }
      else {
        uVar28 = (uint)uVar16;
      }
      uVar16 = *(ulong *)(piStack_13088 + 0x12);
      bVar27 = 0;
      if ((uVar16 & 1) == 0) {
        bVar27 = 0;
        uVar35 = uVar16 & 0xffffffff;
        do {
          uVar35 = uVar35 >> 1;
          bVar27 = bVar27 + 1;
          uVar6 = uVar16 & 2;
          uVar29 = (uint)uVar35;
          uVar16 = uVar35;
        } while (uVar6 == 0);
      }
      else {
        uVar29 = (uint)uVar16;
      }
      if (0 < piStack_13088[1]) {
        if (iVar9 < w) {
          iVar9 = w;
        }
        uStack_13068 = 0;
        lStack_13070 = 0;
        do {
          uVar20 = piStack_13088[0xc] << 0x1e | piStack_13088[0xc] - 8U >> 2;
          if (uVar20 < 7) {
            lVar13 = *(long *)(piStack_13088 + 4);
            lVar19 = (long)(piStack_13088[0xb] * (int)lStack_13070);
            puVar30 = (uint *)(lVar13 + lVar19);
            switch(uVar20) {
            case 0:
              if (0 < *piStack_13088) {
                puVar36 = __s + uStack_13068 + 2;
                iVar22 = *piStack_13088 + 1;
                do {
                  bVar1 = (byte)*puVar30;
                  puVar36[-2] = (uchar)(((bVar1 >> (bVar26 & 0x1f) & uVar34) * 0xff) / uVar34);
                  puVar36[-1] = (uchar)(((bVar1 >> (bVar25 & 0x1f) & uVar28) * 0xff) / uVar28);
                  *puVar36 = (uchar)(((bVar1 >> (bVar27 & 0x1f) & uVar29) * 0xff) / uVar29);
                  puVar30 = (uint *)((long)puVar30 + 1);
                  iVar22 = iVar22 + -1;
                  puVar36 = puVar36 + uVar24;
                } while (1 < iVar22);
              }
              break;
            case 1:
              if (0 < *piStack_13088) {
                puVar36 = __s + uStack_13068 + 2;
                iVar22 = *piStack_13088 + 1;
                bVar37 = false;
                do {
                  if (bVar37) {
                    uVar20 = (*(byte *)((long)puVar30 + 1) & 0xf) << 8 |
                             (uint)*(byte *)((long)puVar30 + 2);
                    lVar13 = 3;
                  }
                  else {
                    uVar20 = (uint)(*(byte *)((long)puVar30 + 1) >> 4) | (uint)(byte)*puVar30 << 4;
                    lVar13 = 0;
                  }
                  bVar37 = !bVar37;
                  puVar36[-2] = (uchar)(((uVar20 >> (bVar26 & 0x1f) & uVar34) * 0xff) / uVar34);
                  puVar36[-1] = (uchar)(((uVar20 >> (bVar25 & 0x1f) & uVar28) * 0xff) / uVar28);
                  *puVar36 = (uchar)(((uVar20 >> (bVar27 & 0x1f) & uVar29) * 0xff) / uVar29);
                  puVar30 = (uint *)((long)puVar30 + lVar13);
                  iVar22 = iVar22 + -1;
                  puVar36 = puVar36 + uVar24;
                } while (1 < iVar22);
              }
              break;
            case 2:
              iVar22 = *piStack_13088;
              if (piStack_13088[6] == 0) {
                if (0 < iVar22) {
                  puVar36 = __s + uStack_13068 + 2;
                  iVar22 = iVar22 + 1;
                  lVar13 = lVar13 + lVar19 + 1;
                  do {
                    uVar8 = *(ushort *)(lVar13 + -1);
                    puVar36[-2] = (uchar)(((uVar8 >> (bVar26 & 0x1f) & uVar34) * 0xff) / uVar34);
                    puVar36[-1] = (uchar)(((uVar8 >> (bVar25 & 0x1f) & uVar28) * 0xff) / uVar28);
                    *puVar36 = (uchar)(((uVar8 >> (bVar27 & 0x1f) & uVar29) * 0xff) / uVar29);
                    iVar22 = iVar22 + -1;
                    lVar13 = lVar13 + 2;
                    puVar36 = puVar36 + uVar24;
                  } while (1 < iVar22);
                }
              }
              else if (0 < iVar22) {
                puVar36 = __s + uStack_13068 + 2;
                iVar22 = iVar22 + 1;
                do {
                  uVar8 = (ushort)*puVar30 << 8 | (ushort)*puVar30 >> 8;
                  puVar36[-2] = (uchar)(((uVar8 >> (bVar26 & 0x1f) & uVar34) * 0xff) / uVar34);
                  puVar36[-1] = (uchar)(((uVar8 >> (bVar25 & 0x1f) & uVar28) * 0xff) / uVar28);
                  *puVar36 = (uchar)(((uVar8 >> (bVar27 & 0x1f) & uVar29) * 0xff) / uVar29);
                  puVar30 = (uint *)((long)puVar30 + 2);
                  iVar22 = iVar22 + -1;
                  puVar36 = puVar36 + uVar24;
                } while (1 < iVar22);
              }
              break;
            case 4:
              iVar22 = *piStack_13088;
              if (piStack_13088[6] == 0) {
                if (0 < iVar22) {
                  puVar36 = __s + uStack_13068 + 2;
                  iVar22 = iVar22 + 1;
                  pbVar32 = (byte *)(lVar13 + lVar19 + 2);
                  do {
                    uVar20 = (uint)pbVar32[-2] | (uint)pbVar32[-1] << 8 | (uint)*pbVar32 << 0x10;
                    puVar36[-2] = (uchar)(((uVar20 >> (bVar26 & 0x1f) & uVar34) * 0xff) / uVar34);
                    puVar36[-1] = (uchar)(((uVar20 >> (bVar25 & 0x1f) & uVar28) * 0xff) / uVar28);
                    *puVar36 = (uchar)(((uVar20 >> (bVar27 & 0x1f) & uVar29) * 0xff) / uVar29);
                    iVar22 = iVar22 + -1;
                    pbVar32 = pbVar32 + 3;
                    puVar36 = puVar36 + uVar24;
                  } while (1 < iVar22);
                }
              }
              else if (0 < iVar22) {
                puVar36 = __s + uStack_13068 + 2;
                iVar22 = iVar22 + 1;
                do {
                  uVar20 = (uint)*(byte *)((long)puVar30 + 2) |
                           (uint)*(byte *)((long)puVar30 + 1) << 8 | (uint)(byte)*puVar30 << 0x10;
                  puVar36[-2] = (uchar)(((uVar20 >> (bVar26 & 0x1f) & uVar34) * 0xff) / uVar34);
                  puVar36[-1] = (uchar)(((uVar20 >> (bVar25 & 0x1f) & uVar28) * 0xff) / uVar28);
                  *puVar36 = (uchar)(((uVar20 >> (bVar27 & 0x1f) & uVar29) * 0xff) / uVar29);
                  puVar30 = (uint *)((long)puVar30 + 3);
                  iVar22 = iVar22 + -1;
                  puVar36 = puVar36 + uVar24;
                } while (1 < iVar22);
              }
              break;
            case 6:
              iVar22 = *piStack_13088;
              if (piStack_13088[6] == 0) {
                if (0 < iVar22) {
                  puVar36 = __s + uStack_13068 + 2;
                  iVar22 = iVar22 + 1;
                  lVar13 = lVar13 + lVar19 + 3;
                  do {
                    iVar21 = *(int *)(lVar13 + -3);
                    puVar36[-2] = (uchar)(((iVar21 >> (bVar26 & 0x1f) & uVar34) * 0xff) / uVar34);
                    puVar36[-1] = (uchar)(((iVar21 >> (bVar25 & 0x1f) & uVar28) * 0xff) / uVar28);
                    *puVar36 = (uchar)(((iVar21 >> (bVar27 & 0x1f) & uVar29) * 0xff) / uVar29);
                    iVar22 = iVar22 + -1;
                    lVar13 = lVar13 + 4;
                    puVar36 = puVar36 + uVar24;
                  } while (1 < iVar22);
                }
              }
              else if (0 < iVar22) {
                puVar36 = __s + uStack_13068 + 2;
                iVar22 = iVar22 + 1;
                do {
                  uVar20 = *puVar30;
                  uVar20 = uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                           uVar20 << 0x18;
                  puVar36[-2] = (uchar)((((int)uVar20 >> (bVar26 & 0x1f) & uVar34) * 0xff) / uVar34)
                  ;
                  puVar36[-1] = (uchar)((((int)uVar20 >> (bVar25 & 0x1f) & uVar28) * 0xff) / uVar28)
                  ;
                  *puVar36 = (uchar)((((int)uVar20 >> (bVar27 & 0x1f) & uVar29) * 0xff) / uVar29);
                  puVar30 = puVar30 + 1;
                  iVar22 = iVar22 + -1;
                  puVar36 = puVar36 + uVar24;
                } while (1 < iVar22);
              }
            }
          }
          lStack_13070 = lStack_13070 + 1;
          uStack_13068 = (ulong)((int)uStack_13068 + iVar9 * uVar24);
        } while (lStack_13070 < piStack_13088[1]);
      }
    }
    (**(code **)(piStack_13088 + 0x18))(piStack_13088);
  }
  return __s;
}

Assistant:

static uchar *read_win_rectangle(uchar *p, int X, int Y, int w, int h, int alpha)
{
  XImage	*image;		// Captured image
  int		i, maxindex;	// Looping vars
  int           x, y;		// Current X & Y in image
  int		d;		// Depth of image
  unsigned char *line,		// Array to hold image row
		*line_ptr;	// Pointer to current line image
  unsigned char	*pixel;		// Current color value
  XColor	colors[4096];	// Colors from the colormap...
  unsigned char	cvals[4096][3];	// Color values from the colormap...
  unsigned	index_mask,
		index_shift,
		red_mask,
		red_shift,
		green_mask,
		green_shift,
		blue_mask,
		blue_shift;


  //
  // Under X11 we have the option of the XGetImage() interface or SGI's
  // ReadDisplay extension which does all of the really hard work for
  // us...
  //
  int allow_outside = w < 0;    // negative w allows negative X or Y, that is, window frame
  if (w < 0) w = - w;

#  ifdef __sgi
  if (XReadDisplayQueryExtension(fl_display, &i, &i)) {
    image = XReadDisplay(fl_display, fl_window, X, Y, w, h, 0, NULL);
  } else
#  else
  image = 0;
#  endif // __sgi

  if (!image) {
    // fetch absolute coordinates
    int dx, dy, sx, sy, sw, sh;
    Window child_win;
    
    Fl_Window *win;
    if (allow_outside) win = (Fl_Window*)1;
    else win = fl_find(fl_window);
    if (win) {
      XTranslateCoordinates(fl_display, fl_window,
          RootWindow(fl_display, fl_screen), X, Y, &dx, &dy, &child_win);
      // screen dimensions
      Fl::screen_xywh(sx, sy, sw, sh, fl_screen);
    }
    if (!win || (dx >= sx && dy >= sy && dx + w <= sx+sw && dy + h <= sy+sh)) {
      // the image is fully contained, we can use the traditional method
      // however, if the window is obscured etc. the function will still fail. Make sure we
      // catch the error and continue, otherwise an exception will be thrown.
      XErrorHandler old_handler = XSetErrorHandler(xgetimageerrhandler);
      image = XGetImage(fl_display, fl_window, X, Y, w, h, AllPlanes, ZPixmap);
      XSetErrorHandler(old_handler);
    } else {
      // image is crossing borders, determine visible region
      int nw, nh, noffx, noffy;
      noffx = fl_subimage_offsets(sx, sw, dx, w, nw);
      noffy = fl_subimage_offsets(sy, sh, dy, h, nh);
      if (nw <= 0 || nh <= 0) return 0;

      // allocate the image
      int bpp = fl_visual->depth + ((fl_visual->depth / 8) % 2) * 8;
      char* buf = (char*)malloc(bpp / 8 * w * h);
      image = XCreateImage(fl_display, fl_visual->visual,
	  fl_visual->depth, ZPixmap, 0, buf, w, h, bpp, 0);
      if (!image) {
	if (buf) free(buf);
	return 0;
      }

      XErrorHandler old_handler = XSetErrorHandler(xgetimageerrhandler);
      XImage *subimg = XGetSubImage(fl_display, fl_window, X + noffx, Y + noffy,
                                    nw, nh, AllPlanes, ZPixmap, image, noffx, noffy);
      XSetErrorHandler(old_handler);
      if (!subimg) {
        XDestroyImage(image);
        return 0;
      }
    }
  }

  if (!image) return 0;

#ifdef DEBUG
  printf("width            = %d\n", image->width);
  printf("height           = %d\n", image->height);
  printf("xoffset          = %d\n", image->xoffset);
  printf("format           = %d\n", image->format);
  printf("data             = %p\n", image->data);
  printf("byte_order       = %d\n", image->byte_order);
  printf("bitmap_unit      = %d\n", image->bitmap_unit);
  printf("bitmap_bit_order = %d\n", image->bitmap_bit_order);
  printf("bitmap_pad       = %d\n", image->bitmap_pad);
  printf("depth            = %d\n", image->depth);
  printf("bytes_per_line   = %d\n", image->bytes_per_line);
  printf("bits_per_pixel   = %d\n", image->bits_per_pixel);
  printf("red_mask         = %08x\n", image->red_mask);
  printf("green_mask       = %08x\n", image->green_mask);
  printf("blue_mask        = %08x\n", image->blue_mask);
  printf("map_entries      = %d\n", fl_visual->visual->map_entries);
#endif // DEBUG

  d = alpha ? 4 : 3;

  // Allocate the image data array as needed...
  if (!p) p = new uchar[w * h * d];

  // Initialize the default colors/alpha in the whole image...
  memset(p, alpha, w * h * d);

  // Check that we have valid mask/shift values...
  if (!image->red_mask && image->bits_per_pixel > 12) {
    // Greater than 12 bits must be TrueColor...
    image->red_mask   = fl_visual->visual->red_mask;
    image->green_mask = fl_visual->visual->green_mask;
    image->blue_mask  = fl_visual->visual->blue_mask;

#ifdef DEBUG
    puts("\n---- UPDATED ----");
    printf("fl_redmask       = %08x\n", fl_redmask);
    printf("fl_redshift      = %d\n", fl_redshift);
    printf("fl_greenmask     = %08x\n", fl_greenmask);
    printf("fl_greenshift    = %d\n", fl_greenshift);
    printf("fl_bluemask      = %08x\n", fl_bluemask);
    printf("fl_blueshift     = %d\n", fl_blueshift);
    printf("red_mask         = %08x\n", image->red_mask);
    printf("green_mask       = %08x\n", image->green_mask);
    printf("blue_mask        = %08x\n", image->blue_mask);
#endif // DEBUG
  }

  // Check if we have colormap image...
  if (!image->red_mask) {
    // Get the colormap entries for this window...
    maxindex = fl_visual->visual->map_entries;

    for (i = 0; i < maxindex; i ++) colors[i].pixel = i;

    XQueryColors(fl_display, fl_colormap, colors, maxindex);

    for (i = 0; i < maxindex; i ++) {
      cvals[i][0] = colors[i].red >> 8;
      cvals[i][1] = colors[i].green >> 8;
      cvals[i][2] = colors[i].blue >> 8;
    }

    // Read the pixels and output an RGB image...
    for (y = 0; y < image->height; y ++) {
      pixel = (unsigned char *)(image->data + y * image->bytes_per_line);
      line  = p + y * w * d;

      switch (image->bits_per_pixel) {
        case 1 :
	  for (x = image->width, line_ptr = line, index_mask = 128;
	       x > 0;
	       x --, line_ptr += d) {
	    if (*pixel & index_mask) {
	      line_ptr[0] = cvals[1][0];
	      line_ptr[1] = cvals[1][1];
	      line_ptr[2] = cvals[1][2];
            } else {
	      line_ptr[0] = cvals[0][0];
	      line_ptr[1] = cvals[0][1];
	      line_ptr[2] = cvals[0][2];
            }

            if (index_mask > 1) {
	      index_mask >>= 1;
	    } else {
              index_mask = 128;
              pixel ++;
            }
	  }
          break;

        case 2 :
	  for (x = image->width, line_ptr = line, index_shift = 6;
	       x > 0;
	       x --, line_ptr += d) {
	    i = (*pixel >> index_shift) & 3;

	    line_ptr[0] = cvals[i][0];
	    line_ptr[1] = cvals[i][1];
	    line_ptr[2] = cvals[i][2];

            if (index_shift > 0) {
              index_mask >>= 2;
              index_shift -= 2;
            } else {
              index_mask  = 192;
              index_shift = 6;
              pixel ++;
            }
	  }
          break;

        case 4 :
	  for (x = image->width, line_ptr = line, index_shift = 4;
	       x > 0;
	       x --, line_ptr += d) {
	    if (index_shift == 4) i = (*pixel >> 4) & 15;
	    else i = *pixel & 15;

	    line_ptr[0] = cvals[i][0];
	    line_ptr[1] = cvals[i][1];
	    line_ptr[2] = cvals[i][2];

            if (index_shift > 0) {
              index_shift = 0;
	    } else {
              index_shift = 4;
              pixel ++;
            }
	  }
          break;

        case 8 :
	  for (x = image->width, line_ptr = line;
	       x > 0;
	       x --, line_ptr += d, pixel ++) {
	    line_ptr[0] = cvals[*pixel][0];
	    line_ptr[1] = cvals[*pixel][1];
	    line_ptr[2] = cvals[*pixel][2];
	  }
          break;

        case 12 :
	  for (x = image->width, line_ptr = line, index_shift = 0;
	       x > 0;
	       x --, line_ptr += d) {
	    if (index_shift == 0) {
	      i = ((pixel[0] << 4) | (pixel[1] >> 4)) & 4095;
	    } else {
	      i = ((pixel[1] << 8) | pixel[2]) & 4095;
	    }

	    line_ptr[0] = cvals[i][0];
	    line_ptr[1] = cvals[i][1];
	    line_ptr[2] = cvals[i][2];

            if (index_shift == 0) {
              index_shift = 4;
            } else {
              index_shift = 0;
              pixel += 3;
            }
	  }
          break;
      }
    }
  } else {
    // RGB(A) image, so figure out the shifts & masks...
    red_mask  = image->red_mask;
    red_shift = 0;

    while ((red_mask & 1) == 0) {
      red_mask >>= 1;
      red_shift ++;
    }

    green_mask  = image->green_mask;
    green_shift = 0;

    while ((green_mask & 1) == 0) {
      green_mask >>= 1;
      green_shift ++;
    }

    blue_mask  = image->blue_mask;
    blue_shift = 0;

    while ((blue_mask & 1) == 0) {
      blue_mask >>= 1;
      blue_shift ++;
    }

    // Read the pixels and output an RGB image...
    for (y = 0; y < image->height; y ++) {
      pixel = (unsigned char *)(image->data + y * image->bytes_per_line);
      line  = p + y * w * d;

      switch (image->bits_per_pixel) {
        case 8 :
	  for (x = image->width, line_ptr = line;
	       x > 0;
	       x --, line_ptr += d, pixel ++) {
	    i = *pixel;

	    line_ptr[0] = 255 * ((i >> red_shift) & red_mask) / red_mask;
	    line_ptr[1] = 255 * ((i >> green_shift) & green_mask) / green_mask;
	    line_ptr[2] = 255 * ((i >> blue_shift) & blue_mask) / blue_mask;
	  }
          break;

        case 12 :
	  for (x = image->width, line_ptr = line, index_shift = 0;
	       x > 0;
	       x --, line_ptr += d) {
	    if (index_shift == 0) {
	      i = ((pixel[0] << 4) | (pixel[1] >> 4)) & 4095;
	    } else {
	      i = ((pixel[1] << 8) | pixel[2]) & 4095;
            }

	    line_ptr[0] = 255 * ((i >> red_shift) & red_mask) / red_mask;
	    line_ptr[1] = 255 * ((i >> green_shift) & green_mask) / green_mask;
	    line_ptr[2] = 255 * ((i >> blue_shift) & blue_mask) / blue_mask;

            if (index_shift == 0) {
              index_shift = 4;
            } else {
              index_shift = 0;
              pixel += 3;
            }
	  }
          break;

        case 16 :
          if (image->byte_order == LSBFirst) {
            // Little-endian...
	    for (x = image->width, line_ptr = line;
	         x > 0;
	         x --, line_ptr += d, pixel += 2) {
	      i = (pixel[1] << 8) | pixel[0];

	      line_ptr[0] = 255 * ((i >> red_shift) & red_mask) / red_mask;
	      line_ptr[1] = 255 * ((i >> green_shift) & green_mask) / green_mask;
	      line_ptr[2] = 255 * ((i >> blue_shift) & blue_mask) / blue_mask;
	    }
	  } else {
            // Big-endian...
	    for (x = image->width, line_ptr = line;
	         x > 0;
	         x --, line_ptr += d, pixel += 2) {
	      i = (pixel[0] << 8) | pixel[1];

	      line_ptr[0] = 255 * ((i >> red_shift) & red_mask) / red_mask;
	      line_ptr[1] = 255 * ((i >> green_shift) & green_mask) / green_mask;
	      line_ptr[2] = 255 * ((i >> blue_shift) & blue_mask) / blue_mask;
	    }
	  }
          break;

        case 24 :
          if (image->byte_order == LSBFirst) {
            // Little-endian...
	    for (x = image->width, line_ptr = line;
	         x > 0;
	         x --, line_ptr += d, pixel += 3) {
	      i = (((pixel[2] << 8) | pixel[1]) << 8) | pixel[0];

	      line_ptr[0] = 255 * ((i >> red_shift) & red_mask) / red_mask;
	      line_ptr[1] = 255 * ((i >> green_shift) & green_mask) / green_mask;
	      line_ptr[2] = 255 * ((i >> blue_shift) & blue_mask) / blue_mask;
	    }
	  } else {
            // Big-endian...
	    for (x = image->width, line_ptr = line;
	         x > 0;
	         x --, line_ptr += d, pixel += 3) {
	      i = (((pixel[0] << 8) | pixel[1]) << 8) | pixel[2];

	      line_ptr[0] = 255 * ((i >> red_shift) & red_mask) / red_mask;
	      line_ptr[1] = 255 * ((i >> green_shift) & green_mask) / green_mask;
	      line_ptr[2] = 255 * ((i >> blue_shift) & blue_mask) / blue_mask;
	    }
	  }
          break;

        case 32 :
          if (image->byte_order == LSBFirst) {
            // Little-endian...
	    for (x = image->width, line_ptr = line;
	         x > 0;
	         x --, line_ptr += d, pixel += 4) {
	      i = (((((pixel[3] << 8) | pixel[2]) << 8) | pixel[1]) << 8) | pixel[0];

	      line_ptr[0] = 255 * ((i >> red_shift) & red_mask) / red_mask;
	      line_ptr[1] = 255 * ((i >> green_shift) & green_mask) / green_mask;
	      line_ptr[2] = 255 * ((i >> blue_shift) & blue_mask) / blue_mask;
	    }
	  } else {
            // Big-endian...
	    for (x = image->width, line_ptr = line;
	         x > 0;
	         x --, line_ptr += d, pixel += 4) {
	      i = (((((pixel[0] << 8) | pixel[1]) << 8) | pixel[2]) << 8) | pixel[3];

	      line_ptr[0] = 255 * ((i >> red_shift) & red_mask) / red_mask;
	      line_ptr[1] = 255 * ((i >> green_shift) & green_mask) / green_mask;
	      line_ptr[2] = 255 * ((i >> blue_shift) & blue_mask) / blue_mask;
	    }
	  }
          break;
      }
    }
  }

  // Destroy the X image we've read and return the RGB(A) image...
  XDestroyImage(image);

  return p;
}